

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::remove_edge(Graph *this,vertex_t s,vertex_t t)

{
  reference pvVar1;
  reference pvVar2;
  iterator __first;
  iterator __last;
  reference pvVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  const_iterator local_48;
  uint *local_40;
  uint *local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  const_iterator local_20;
  vertex_t local_18;
  uint local_14;
  vertex_t t_local;
  vertex_t s_local;
  Graph *this_local;
  
  local_18 = t;
  local_14 = s;
  _t_local = this;
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,(ulong)s);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,(ulong)local_14);
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar2);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,(ulong)local_14);
  local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar2);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (local_30,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_38,&local_18);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_20,&local_28);
  local_40 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                               (pvVar1,local_20);
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->pred_,(ulong)local_18);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->pred_,(ulong)local_18);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar2);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->pred_,(ulong)local_18);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar2);
  local_50 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (__first._M_current,__last._M_current,&local_14);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_48,&local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(pvVar1,local_48);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->deg_,(ulong)local_14)
  ;
  *pvVar3 = *pvVar3 - 1;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->deg_,(ulong)local_18)
  ;
  *pvVar3 = *pvVar3 - 1;
  return;
}

Assistant:

void Graph::remove_edge(vertex_t s, vertex_t t) {
    // TODO check existence
    succ_.at(s).erase(find(succ_.at(s).begin(), succ_.at(s).end(), t));
    pred_.at(t).erase(find(pred_.at(t).begin(), pred_.at(t).end(), s));

    --deg_.at(s);
    --deg_.at(t);
}